

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O0

void __thiscall Glucose::ClausesBuffer::setNbThreads(ClausesBuffer *this,int _nbThreads)

{
  int iVar1;
  uint *puVar2;
  int in_ESI;
  vec<unsigned_int> *in_RDI;
  int i;
  uint _maxsize;
  uint in_stack_ffffffffffffffdc;
  int local_14;
  
  iVar1 = *(int *)&in_RDI[3].data * in_ESI;
  *(int *)((long)&in_RDI[1].data + 4) = iVar1 + -1;
  in_RDI[1].sz = iVar1;
  in_RDI[2].sz = in_ESI;
  vec<unsigned_int>::growTo(in_RDI,in_stack_ffffffffffffffdc);
  for (local_14 = 0; local_14 < in_RDI[2].sz; local_14 = local_14 + 1) {
    in_stack_ffffffffffffffdc = iVar1 - 1;
    puVar2 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&in_RDI[3].sz,local_14);
    *puVar2 = in_stack_ffffffffffffffdc;
  }
  vec<unsigned_int>::growTo(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void ClausesBuffer::setNbThreads(int _nbThreads) {
    unsigned int _maxsize = fifoSizeByCore*_nbThreads;
    last = _maxsize -1;
    maxsize = _maxsize;
    nbThreads = _nbThreads;
    lastOfThread.growTo(_nbThreads);
    for(int i=0;i<nbThreads;i++) lastOfThread[i] = _maxsize-1;
    elems.growTo(maxsize);
}